

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::FieldName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  bool bVar1;
  string result;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  (anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)this,field);
  anon_unknown_0::UnderscoresToCamelCase(&local_60,&local_40,false);
  if ((*(int *)(this + 0x4c) != 3) ||
     (bVar1 = FieldDescriptor::is_map((FieldDescriptor *)this), bVar1)) {
    std::__cxx11::string::string((string *)&local_80,"Array",&local_81);
    bVar1 = HasSuffixString(&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (!bVar1) goto LAB_0025f033;
  }
  std::__cxx11::string::append((char *)&local_60);
LAB_0025f033:
  std::__cxx11::string::string((string *)&local_80,"_p",&local_81);
  anon_unknown_0::SanitizeNameForObjC(__return_storage_ptr__,&local_60,&local_80,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string FieldName(const FieldDescriptor* field) {
  const string& name = NameFromFieldDescriptor(field);
  string result = UnderscoresToCamelCase(name, false);
  if (field->is_repeated() && !field->is_map()) {
    // Add "Array" before do check for reserved worlds.
    result += "Array";
  } else {
    // If it wasn't repeated, but ends in "Array", force on the _p suffix.
    if (HasSuffixString(result, "Array")) {
      result += "_p";
    }
  }
  return SanitizeNameForObjC(result, "_p", NULL);
}